

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bingo.hpp
# Opt level: O0

void __thiscall BingoGenerator::init_consumable_goals(BingoGenerator *this)

{
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  BingoGenerator *pBStack_10;
  int i;
  BingoGenerator *this_local;
  
  pBStack_10 = this;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[14]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->_consumable_goals,(char (*) [14])"Have 9 EkeEke");
  for (local_14 = 6; local_14 < 10; local_14 = local_14 + 1) {
    std::__cxx11::to_string(&local_78,local_14);
    std::operator+(&local_58,"Have ",&local_78);
    std::operator+(&local_38,&local_58," Detox Grass");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->_consumable_goals,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::to_string(&local_e8,local_14);
    std::operator+(&local_c8,"Have ",&local_e8);
    std::operator+(&local_a8,&local_c8," Dahl");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->_consumable_goals,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::to_string(&local_148,local_14);
    std::operator+(&local_128,"Have ",&local_148);
    std::operator+(&local_108,&local_128," Anti-Paralyze");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->_consumable_goals,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::to_string(&local_1a8,local_14);
    std::operator+(&local_188,"Have ",&local_1a8);
    std::operator+(&local_168,&local_188," Restoration");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->_consumable_goals,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::to_string(&local_208,local_14);
    std::operator+(&local_1e8,"Have ",&local_208);
    std::operator+(&local_1c8,&local_1e8," Statue of Gaia");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->_consumable_goals,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::to_string(&local_268,local_14);
    std::operator+(&local_248,"Have ",&local_268);
    std::operator+(&local_228,&local_248," Golden Statue");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->_consumable_goals,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
  }
  vectools::shuffle<std::__cxx11::string>(&this->_consumable_goals,&this->_rng);
  return;
}

Assistant:

void init_consumable_goals()
    {
        _consumable_goals.emplace_back("Have 9 EkeEke");
        for(int i = 6 ; i <= 9 ; ++i)
        {
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Detox Grass");
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Dahl");
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Anti-Paralyze");
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Restoration");
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Statue of Gaia");
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Golden Statue");
        }
        vectools::shuffle(_consumable_goals, _rng);
        // Short Cakes ? Pawn Tickets ?
    }